

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void shiftConstraints(QList<QSimplexConstraint_*> *constraints,qreal amount)

{
  QSimplexConstraint *this;
  int i;
  ulong uVar1;
  double dVar2;
  const_iterator __first;
  
  for (uVar1 = 0; uVar1 < (ulong)(constraints->d).size; uVar1 = uVar1 + 1) {
    this = (constraints->d).ptr[uVar1];
    __first = QHash<QSimplexVariable_*,_double>::cbegin(&this->variables);
    dVar2 = std::accumulate<QHash<QSimplexVariable*,double>::const_iterator,double>
                      (__first,(const_iterator)ZEXT816(0),0.0);
    this->constant = dVar2 * amount + this->constant;
  }
  return;
}

Assistant:

static void shiftConstraints(const QList<QSimplexConstraint *> &constraints, qreal amount)
{
    for (int i = 0; i < constraints.size(); ++i) {
        QSimplexConstraint *c = constraints.at(i);
        const qreal multiplier = std::accumulate(c->variables.cbegin(), c->variables.cend(), qreal(0));
        c->constant += multiplier * amount;
    }
}